

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto7u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  OPJ_INT32 OVar7;
  sbyte sVar8;
  ulong uVar9;
  byte *pbVar10;
  uint local_4c;
  int remaining;
  uint trailing;
  OPJ_UINT32 src7;
  OPJ_UINT32 src6;
  OPJ_UINT32 src5;
  OPJ_UINT32 src4;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffff8); _src1 = _src1 + 8) {
    uVar1 = pSrc[_src1 + 1];
    uVar2 = pSrc[_src1 + 2];
    uVar3 = pSrc[_src1 + 3];
    uVar4 = pSrc[_src1 + 4];
    uVar5 = pSrc[_src1 + 5];
    uVar6 = pSrc[_src1 + 6];
    OVar7 = pSrc[_src1 + 7];
    *(byte *)length_local = (byte)(pSrc[_src1] << 1) | (byte)(uVar1 >> 6);
    *(byte *)(length_local + 1) = (byte)(uVar1 << 2) | (byte)(uVar2 >> 5);
    *(byte *)(length_local + 2) = (byte)(uVar2 << 3) | (byte)(uVar3 >> 4);
    *(byte *)(length_local + 3) = (byte)(uVar3 << 4) | (byte)(uVar4 >> 3);
    *(byte *)(length_local + 4) = (byte)(uVar4 << 5) | (byte)(uVar5 >> 2);
    pbVar10 = (byte *)(length_local + 6);
    *(byte *)(length_local + 5) = (byte)(uVar5 << 6) | (byte)(uVar6 >> 1);
    length_local = length_local + 7;
    *pbVar10 = (byte)(uVar6 << 7) | (byte)OVar7;
  }
  if ((length & 7) != 0) {
    uVar9 = length & 7;
    local_4c = pSrc[_src1];
    sVar8 = 1;
    pbVar10 = (byte *)length_local;
    if (1 < uVar9) {
      *(byte *)length_local = (byte)((uint)pSrc[_src1 + 1] >> 6) | (byte)(local_4c << 1);
      local_4c = pSrc[_src1 + 1] & 0x3f;
      sVar8 = 2;
      pbVar10 = (byte *)(length_local + 1);
      if (2 < uVar9) {
        *(byte *)(length_local + 1) = (byte)((uint)pSrc[_src1 + 2] >> 5) | (byte)(local_4c << 2);
        local_4c = pSrc[_src1 + 2] & 0x1f;
        sVar8 = 3;
        pbVar10 = (byte *)(length_local + 2);
        if (3 < uVar9) {
          *(byte *)(length_local + 2) = (byte)((uint)pSrc[_src1 + 3] >> 4) | (byte)(local_4c << 3);
          local_4c = pSrc[_src1 + 3] & 0xf;
          sVar8 = 4;
          pbVar10 = (byte *)(length_local + 3);
          if (4 < uVar9) {
            *(byte *)(length_local + 3) = (byte)((uint)pSrc[_src1 + 4] >> 3) | (byte)(local_4c << 4)
            ;
            local_4c = pSrc[_src1 + 4] & 7;
            sVar8 = 5;
            pbVar10 = (byte *)(length_local + 4);
            if (5 < uVar9) {
              *(byte *)(length_local + 4) =
                   (byte)((uint)pSrc[_src1 + 5] >> 2) | (byte)(local_4c << 5);
              local_4c = pSrc[_src1 + 5] & 3;
              sVar8 = 6;
              pbVar10 = (byte *)(length_local + 5);
              if (6 < uVar9) {
                *(byte *)(length_local + 5) =
                     (byte)((uint)pSrc[_src1 + 6] >> 1) | (byte)(local_4c << 6);
                local_4c = pSrc[_src1 + 6] & 1;
                sVar8 = 7;
                pbVar10 = (byte *)(length_local + 6);
              }
            }
          }
        }
      }
    }
    length_local = (OPJ_SIZE_T)pbVar10;
    if (sVar8 != 8) {
      *(char *)length_local = (char)(local_4c << sVar8);
    }
  }
  return;
}

Assistant:

static void tif_32sto7u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 1) | (src1 >> 6));
        *pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 5));
        *pDst++ = (OPJ_BYTE)((src2 << 3) | (src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 3));
        *pDst++ = (OPJ_BYTE)((src4 << 5) | (src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 1));
        *pDst++ = (OPJ_BYTE)((src6 << 7) | (src7));
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS((OPJ_UINT32)pSrc[i + 0], 7)
        if (length > 1U) {
            PUTBITS((OPJ_UINT32)pSrc[i + 1], 7)
            if (length > 2U) {
                PUTBITS((OPJ_UINT32)pSrc[i + 2], 7)
                if (length > 3U) {
                    PUTBITS((OPJ_UINT32)pSrc[i + 3], 7)
                    if (length > 4U) {
                        PUTBITS((OPJ_UINT32)pSrc[i + 4], 7)
                        if (length > 5U) {
                            PUTBITS((OPJ_UINT32)pSrc[i + 5], 7)
                            if (length > 6U) {
                                PUTBITS((OPJ_UINT32)pSrc[i + 6], 7)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}